

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llb1Reach.c
# Opt level: O3

DdNode * Llb_ManConstructQuantCubeBwd(Llb_Man_t *p,Llb_Grp_t *pGroup,int iGrpPlace)

{
  int iVar1;
  int iVar2;
  DdManager *dd;
  abctime aVar3;
  int *piVar4;
  DdNode *pDVar5;
  Vec_Ptr_t *pVVar6;
  long lVar7;
  long lVar8;
  DdNode *pDVar9;
  
  dd = p->dd;
  aVar3 = dd->TimeStop;
  dd->TimeStop = 0;
  pDVar5 = Cudd_ReadOne(dd);
  Cudd_Ref(pDVar5);
  pVVar6 = pGroup->vIns;
  if (0 < pVVar6->nSize) {
    lVar8 = 0;
    pDVar9 = pDVar5;
    do {
      piVar4 = (int *)pVVar6->pArray[lVar8];
      pDVar5 = pDVar9;
      if (((piVar4[6] & 7U) != 2) || (p->pAig->nTruePis <= *piVar4)) {
        iVar1 = piVar4[9];
        lVar7 = (long)iVar1;
        if ((lVar7 < 0) || (p->vVarBegs->nSize <= iVar1)) goto LAB_008263ed;
        iVar2 = p->vVarBegs->pArray[lVar7];
        if (iGrpPlace < iVar2) {
          __assert_fail("iGroupFirst <= iGrpPlace",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/bdd/llb/llb1Reach.c"
                        ,0x106,"DdNode *Llb_ManConstructQuantCubeBwd(Llb_Man_t *, Llb_Grp_t *, int)"
                       );
        }
        if (iGrpPlace <= iVar2) {
          if (p->vObj2Var->nSize <= iVar1) goto LAB_008263ed;
          pDVar5 = Cudd_bddIthVar(p->dd,p->vObj2Var->pArray[lVar7]);
          pDVar5 = Cudd_bddAnd(p->dd,pDVar9,pDVar5);
          Cudd_Ref(pDVar5);
          Cudd_RecursiveDeref(p->dd,pDVar9);
          pVVar6 = pGroup->vIns;
        }
      }
      lVar8 = lVar8 + 1;
      pDVar9 = pDVar5;
    } while (lVar8 < pVVar6->nSize);
  }
  pVVar6 = pGroup->vOuts;
  if (0 < pVVar6->nSize) {
    lVar8 = 0;
    pDVar9 = pDVar5;
    do {
      piVar4 = (int *)pVVar6->pArray[lVar8];
      pDVar5 = pDVar9;
      if (((piVar4[6] & 7U) != 2) || (p->pAig->nTruePis <= *piVar4)) {
        iVar1 = piVar4[9];
        lVar7 = (long)iVar1;
        if ((lVar7 < 0) || (p->vVarBegs->nSize <= iVar1)) {
LAB_008263ed:
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecInt.h"
                        ,0x19e,"int Vec_IntEntry(Vec_Int_t *, int)");
        }
        iVar2 = p->vVarBegs->pArray[lVar7];
        if (iGrpPlace < iVar2) {
          __assert_fail("iGroupFirst <= iGrpPlace",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/bdd/llb/llb1Reach.c"
                        ,0x112,"DdNode *Llb_ManConstructQuantCubeBwd(Llb_Man_t *, Llb_Grp_t *, int)"
                       );
        }
        if (iGrpPlace <= iVar2) {
          if (p->vObj2Var->nSize <= iVar1) goto LAB_008263ed;
          pDVar5 = Cudd_bddIthVar(p->dd,p->vObj2Var->pArray[lVar7]);
          pDVar5 = Cudd_bddAnd(p->dd,pDVar9,pDVar5);
          Cudd_Ref(pDVar5);
          Cudd_RecursiveDeref(p->dd,pDVar9);
          pVVar6 = pGroup->vOuts;
        }
      }
      lVar8 = lVar8 + 1;
      pDVar9 = pDVar5;
    } while (lVar8 < pVVar6->nSize);
  }
  Cudd_Deref(pDVar5);
  p->dd->TimeStop = aVar3;
  return pDVar5;
}

Assistant:

DdNode * Llb_ManConstructQuantCubeBwd( Llb_Man_t * p, Llb_Grp_t * pGroup, int iGrpPlace )
{
    Aig_Obj_t * pObj;
    DdNode * bRes, * bTemp, * bVar;
    int i, iGroupFirst;
    abctime TimeStop;
    TimeStop = p->dd->TimeStop; p->dd->TimeStop = 0;
    bRes = Cudd_ReadOne( p->dd );   Cudd_Ref( bRes );
    Vec_PtrForEachEntry( Aig_Obj_t *, pGroup->vIns, pObj, i )
    {
        if ( Saig_ObjIsPi(p->pAig, pObj) )
            continue;
        iGroupFirst = Vec_IntEntry(p->vVarBegs, Aig_ObjId(pObj));
        assert( iGroupFirst <= iGrpPlace );
        if ( iGroupFirst < iGrpPlace )
            continue;
        bVar  = Cudd_bddIthVar( p->dd, Vec_IntEntry(p->vObj2Var, Aig_ObjId(pObj)) );
        bRes  = Cudd_bddAnd( p->dd, bTemp = bRes, bVar );  Cudd_Ref( bRes );
        Cudd_RecursiveDeref( p->dd, bTemp );
    }
    Vec_PtrForEachEntry( Aig_Obj_t *, pGroup->vOuts, pObj, i )
    {
        if ( Saig_ObjIsPi(p->pAig, pObj) )
            continue;
        iGroupFirst = Vec_IntEntry(p->vVarBegs, Aig_ObjId(pObj));
        assert( iGroupFirst <= iGrpPlace );
        if ( iGroupFirst < iGrpPlace )
            continue;
        bVar  = Cudd_bddIthVar( p->dd, Vec_IntEntry(p->vObj2Var, Aig_ObjId(pObj)) );
        bRes  = Cudd_bddAnd( p->dd, bTemp = bRes, bVar );  Cudd_Ref( bRes );
        Cudd_RecursiveDeref( p->dd, bTemp );
    }
    Cudd_Deref( bRes );
    p->dd->TimeStop = TimeStop;
    return bRes;
}